

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result __thiscall
testing::internal::FunctionMockerBase<unsigned_char_(unsigned_short)>::PerformDefaultAction
          (FunctionMockerBase<unsigned_char_(unsigned_short)> *this,type args,
          string *call_description)

{
  OnCallSpec<unsigned_char_(unsigned_short)> *this_00;
  pointer pcVar1;
  bool bVar2;
  Result RVar3;
  Result RVar4;
  Action<unsigned_char_(unsigned_short)> *this_01;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar5;
  string message;
  _Head_base<0UL,_unsigned_short,_false> local_4a;
  long *local_48 [2];
  long local_38 [2];
  
  ppvVar5 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while (ppvVar5 !=
         (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
         super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
         super__Vector_impl_data._M_start) {
    this_00 = (OnCallSpec<unsigned_char_(unsigned_short)> *)ppvVar5[-1];
    ppvVar5 = ppvVar5 + -1;
    bVar2 = OnCallSpec<unsigned_char_(unsigned_short)>::Matches(this_00,args);
    if (bVar2) {
      this_01 = OnCallSpec<unsigned_char_(unsigned_short)>::GetAction(this_00);
      local_4a._M_head_impl =
           (args->super__Tuple_impl<0UL,_unsigned_short>).
           super__Head_base<0UL,_unsigned_short,_false>._M_head_impl;
      RVar3 = Action<unsigned_char_(unsigned_short)>::Perform(this_01,(ArgumentTuple *)&local_4a);
      return RVar3;
    }
  }
  pcVar1 = (call_description->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_48);
  if (DefaultValue<unsigned_char>::producer_ == (long *)0x0) {
    RVar4 = '\0';
  }
  else {
    RVar4 = (**(code **)(*DefaultValue<unsigned_char>::producer_ + 0x10))();
  }
  if (local_48[0] == local_38) {
    return RVar4;
  }
  operator_delete(local_48[0],local_38[0] + 1);
  return RVar4;
}

Assistant:

Result PerformDefaultAction(
      typename RvalueRef<typename Function<F>::ArgumentTuple>::type args,
      const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(internal::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }